

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void concept_suite::forward_iterator_multipass(void)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  initializer_list<int> __l;
  iterator a;
  vector<int,_std::allocator<int>_> data;
  iterator b;
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<int> local_70;
  vector<int,_std::allocator<int>_> local_60;
  iterator_type local_48;
  circular_view<int,_18446744073709551615UL> local_38;
  
  local_38.member.data = (pointer)0x160000000b;
  local_38.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_70);
  local_38.member.data = (pointer)0x0;
  if ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_38.member.data =
         local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_38.member.cap =
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_70.current = 0;
  local_48.current = 0;
  local_70.parent = &local_38;
  local_48.parent = &local_38;
  local_38.member.size = local_38.member.cap;
  local_38.member.next = local_38.member.cap;
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_70,&local_48);
  boost::detail::test_impl
            ("a == b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x8e,"void concept_suite::forward_iterator_multipass()",bVar2);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_70);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_48);
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_70,&local_48);
  boost::detail::test_impl
            ("a == b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x91,"void concept_suite::forward_iterator_multipass()",bVar2);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_70);
  iVar1 = *piVar3;
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_48);
  boost::detail::test_impl
            ("*a == *b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x92,"void concept_suite::forward_iterator_multipass()",iVar1 == *piVar3);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void forward_iterator_multipass()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.begin();
    circular_view<int>::iterator b = a;
    BOOST_TEST(a == b);
    ++a;
    ++b;
    BOOST_TEST(a == b);
    BOOST_TEST(*a == *b);
}